

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::MergeFrom
          (TreeEnsembleParameters_TreeNode *this,TreeEnsembleParameters_TreeNode *from)

{
  bool bVar1;
  TreeEnsembleParameters_TreeNode_TreeNodeBehavior TVar2;
  LogMessage *other;
  uint64_t uVar3;
  double dVar4;
  uint64_t raw_relativehitrate;
  double tmp_relativehitrate;
  uint64_t raw_branchfeaturevalue;
  double tmp_branchfeaturevalue;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  TreeEnsembleParameters_TreeNode *local_18;
  TreeEnsembleParameters_TreeNode *from_local;
  TreeEnsembleParameters_TreeNode *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x330);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::
  RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::MergeFrom
            (&this->evaluationinfo_,&local_18->evaluationinfo_);
  uVar3 = _internal_treeid(local_18);
  if (uVar3 != 0) {
    uVar3 = _internal_treeid(local_18);
    _internal_set_treeid(this,uVar3);
  }
  uVar3 = _internal_nodeid(local_18);
  if (uVar3 != 0) {
    uVar3 = _internal_nodeid(local_18);
    _internal_set_nodeid(this,uVar3);
  }
  TVar2 = _internal_nodebehavior(local_18);
  if (TVar2 != TreeEnsembleParameters_TreeNode_TreeNodeBehavior_BranchOnValueLessThanEqual) {
    TVar2 = _internal_nodebehavior(local_18);
    _internal_set_nodebehavior(this,TVar2);
  }
  bVar1 = _internal_missingvaluetrackstruechild(local_18);
  if (bVar1) {
    bVar1 = _internal_missingvaluetrackstruechild(local_18);
    _internal_set_missingvaluetrackstruechild(this,bVar1);
  }
  uVar3 = _internal_branchfeatureindex(local_18);
  if (uVar3 != 0) {
    uVar3 = _internal_branchfeatureindex(local_18);
    _internal_set_branchfeatureindex(this,uVar3);
  }
  dVar4 = _internal_branchfeaturevalue(local_18);
  if (dVar4 != 0.0) {
    dVar4 = _internal_branchfeaturevalue(local_18);
    _internal_set_branchfeaturevalue(this,dVar4);
  }
  uVar3 = _internal_truechildnodeid(local_18);
  if (uVar3 != 0) {
    uVar3 = _internal_truechildnodeid(local_18);
    _internal_set_truechildnodeid(this,uVar3);
  }
  uVar3 = _internal_falsechildnodeid(local_18);
  if (uVar3 != 0) {
    uVar3 = _internal_falsechildnodeid(local_18);
    _internal_set_falsechildnodeid(this,uVar3);
  }
  dVar4 = _internal_relativehitrate(local_18);
  if (dVar4 != 0.0) {
    dVar4 = _internal_relativehitrate(local_18);
    _internal_set_relativehitrate(this,dVar4);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode::MergeFrom(const TreeEnsembleParameters_TreeNode& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  evaluationinfo_.MergeFrom(from.evaluationinfo_);
  if (from._internal_treeid() != 0) {
    _internal_set_treeid(from._internal_treeid());
  }
  if (from._internal_nodeid() != 0) {
    _internal_set_nodeid(from._internal_nodeid());
  }
  if (from._internal_nodebehavior() != 0) {
    _internal_set_nodebehavior(from._internal_nodebehavior());
  }
  if (from._internal_missingvaluetrackstruechild() != 0) {
    _internal_set_missingvaluetrackstruechild(from._internal_missingvaluetrackstruechild());
  }
  if (from._internal_branchfeatureindex() != 0) {
    _internal_set_branchfeatureindex(from._internal_branchfeatureindex());
  }
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_branchfeaturevalue = from._internal_branchfeaturevalue();
  uint64_t raw_branchfeaturevalue;
  memcpy(&raw_branchfeaturevalue, &tmp_branchfeaturevalue, sizeof(tmp_branchfeaturevalue));
  if (raw_branchfeaturevalue != 0) {
    _internal_set_branchfeaturevalue(from._internal_branchfeaturevalue());
  }
  if (from._internal_truechildnodeid() != 0) {
    _internal_set_truechildnodeid(from._internal_truechildnodeid());
  }
  if (from._internal_falsechildnodeid() != 0) {
    _internal_set_falsechildnodeid(from._internal_falsechildnodeid());
  }
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_relativehitrate = from._internal_relativehitrate();
  uint64_t raw_relativehitrate;
  memcpy(&raw_relativehitrate, &tmp_relativehitrate, sizeof(tmp_relativehitrate));
  if (raw_relativehitrate != 0) {
    _internal_set_relativehitrate(from._internal_relativehitrate());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}